

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

bool __thiscall
duckdb::DictionaryDecoder::DictionarySupportsFilter
          (DictionaryDecoder *this,TableFilter *filter,TableFilterState *filter_state)

{
  bool bVar1;
  bool bVar2;
  ConjunctionOrFilter *pCVar3;
  ConjunctionAndFilter *pCVar4;
  const_reference pvVar5;
  type pTVar6;
  reference pvVar7;
  type pTVar8;
  ExpressionFilter *this_00;
  idx_t child_idx;
  ulong uVar9;
  LogicalType local_88;
  Value local_70;
  
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NOT_NULL:
    bVar2 = true;
    break;
  default:
    bVar2 = false;
    break;
  case CONJUNCTION_OR:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    uVar9 = 0;
    do {
      bVar2 = (ulong)((long)(pCVar3->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar3->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9;
      if (bVar2) {
        return bVar2;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar3->super_ConjunctionFilter).child_filters,uVar9);
      pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar5);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                            *)(filter_state + 1),uVar9);
      pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar7);
      bVar1 = DictionarySupportsFilter(this,pTVar6,pTVar8);
      uVar9 = uVar9 + 1;
    } while (bVar1);
    break;
  case CONJUNCTION_AND:
    pCVar4 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    uVar9 = 0;
    do {
      bVar2 = (ulong)((long)(pCVar4->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar4->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9;
      if (bVar2) {
        return bVar2;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar4->super_ConjunctionFilter).child_filters,uVar9);
      pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar5);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                            *)(filter_state + 1),uVar9);
      pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar7);
      bVar1 = DictionarySupportsFilter(this,pTVar6,pTVar8);
      uVar9 = uVar9 + 1;
    } while (bVar1);
    break;
  case EXPRESSION_FILTER:
    this_00 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    LogicalType::LogicalType(&local_88,&this->reader->column_schema->type);
    Value::Value(&local_70,&local_88);
    bVar2 = ExpressionFilter::EvaluateWithConstant
                      (this_00,(ExpressionExecutor *)(filter_state + 1),&local_70);
    Value::~Value(&local_70);
    LogicalType::~LogicalType(&local_88);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool DictionaryDecoder::DictionarySupportsFilter(const TableFilter &filter, TableFilterState &filter_state) {
	switch (filter.filter_type) {
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction = filter.Cast<ConjunctionOrFilter>();
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			if (!DictionarySupportsFilter(child_filter, child_state)) {
				return false;
			}
		}
		return true;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			if (!DictionarySupportsFilter(child_filter, child_state)) {
				return false;
			}
		}
		return true;
	}
	case TableFilterType::CONSTANT_COMPARISON:
	case TableFilterType::IS_NOT_NULL:
		return true;
	case TableFilterType::EXPRESSION_FILTER: {
		// expression filters can only be pushed into the dictionary if they filter out NULL values
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto &state = filter_state.Cast<ExpressionFilterState>();
		auto emits_nulls = expr_filter.EvaluateWithConstant(state.executor, Value(reader.Type()));
		return !emits_nulls;
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::DYNAMIC_FILTER:
	case TableFilterType::OPTIONAL_FILTER:
	case TableFilterType::STRUCT_EXTRACT:
	default:
		return false;
	}
}